

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvp_fe_tests.cc
# Opt level: O0

void __thiscall
lf::uscalfe::test::lf_bvpfe_Neu_BVP_ass_Test::~lf_bvpfe_Neu_BVP_ass_Test
          (lf_bvpfe_Neu_BVP_ass_Test *this)

{
  lf_bvpfe_Neu_BVP_ass_Test *this_local;
  
  ~lf_bvpfe_Neu_BVP_ass_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lf_bvpfe, Neu_BVP_ass) {
  std::cout << "#### TEST: Assembly for Neumann BVP ###" << std::endl;
  // Right-hand side source function
  auto f = [](Eigen::Vector2d x) -> double {
    return (std::sin(2 * base::kPi * x[0]) * std::sin(2 * base::kPi * x[1]));
  };
  // Neumann data
  auto h = [](Eigen::Vector2d /*x*/) -> double { return 1.0; };

  // Class describing the Neumann boundary value problem
  std::shared_ptr<PureNeumannProblemLaplacian<decltype(f), decltype(h)>> bvp_p =
      std::make_shared<PureNeumannProblemLaplacian<decltype(f), decltype(h)>>(
          f, h);

  // Obtain finite Element space
  // Building the test mesh: a general hybrid mesh
  auto mesh_p = lf::mesh::test_utils::GenerateHybrid2DTestMesh(0);

  // Set up global FE space; lowest order Lagrangian finite elements
  auto fe_space = std::make_shared<FeSpaceLagrangeO1<double>>(mesh_p);

  // Generate linear system
  auto [A, phi] = SecOrdEllBVPLagrFELinSys<double>(fe_space, bvp_p);

  Eigen::MatrixXd A_dense = A;
  std::cout << "Galerkin matrix = " << A_dense << std::endl;
  std::cout << "rhs. vector = " << phi.transpose() << std::endl;
  EXPECT_NEAR(A_dense.rowwise().sum().norm(), 0.0, 1.0E-10)
      << "Row sum not zero";
  EXPECT_NEAR(A_dense.colwise().sum().norm(), 0.0, 1.0E-10)
      << "Col sum not zero";
}